

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O3

const_iterator * __thiscall
ft::setBase<int,_ft::less<int>,_ft::allocator<int>_>::upper_bound
          (const_iterator *__return_storage_ptr__,
          setBase<int,_ft::less<int>,_ft::allocator<int>_> *this,key_type *k)

{
  rbtree *prVar1;
  treeNode<int> *ptVar2;
  treeNode<int> *ptVar3;
  treeNode<int> *ptVar4;
  treeNode<int> *ptVar5;
  treeNode<int> *ptVar6;
  bool bVar7;
  
  prVar1 = &(this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree;
  ptVar2 = (this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_last;
  ptVar6 = ((this->super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>).m_tree.m_first
           )->parent;
  ptVar5 = ptVar2;
  if (ptVar6 != ptVar2) {
    ptVar3 = prVar1->NIL;
    do {
      ptVar5 = ptVar6;
      if (*k < ptVar6->value) break;
      ptVar4 = ptVar6->right;
      if (ptVar6->right == ptVar3) {
        do {
          ptVar6 = ptVar5->parent;
          bVar7 = ptVar6->right == ptVar5;
          ptVar5 = ptVar6;
        } while (bVar7);
      }
      else {
        do {
          ptVar6 = ptVar4;
          ptVar4 = ptVar6->left;
        } while (ptVar6->left != ptVar3);
      }
      ptVar5 = ptVar2;
    } while (ptVar6 != ptVar2);
  }
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_tree =
       prVar1;
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).m_node =
       ptVar5;
  (__return_storage_ptr__->super_treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>).
  _vptr_treeIterator = (_func_int **)&PTR__treeIterator_0010dcb8;
  return __return_storage_ptr__;
}

Assistant:

const_iterator	upper_bound(key_type const & k) const
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, *it)) return it;
		}
		return this->end();
	}